

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

Error __thiscall
asmjit::BaseCompiler::_newFuncNode(BaseCompiler *this,FuncNode **out,FuncSignature *signature)

{
  undefined1 *this_00;
  FuncNode **ppFVar1;
  Error EVar2;
  uint32_t uVar3;
  SentinelNode *pSVar4;
  ArgPack *__s;
  BaseCompiler *unaff_RBX;
  ZoneAllocator *unaff_R12;
  FuncSignature *unaff_R13;
  FuncNode **unaff_R14;
  FuncNode *unaff_R15;
  size_t local_40;
  FuncNode **local_38;
  
  *out = (FuncNode *)0x0;
  if ((this->super_BaseBuilder)._allocator._zone == (Zone *)0x0) {
    _newFuncNode();
LAB_001153b2:
    EVar2 = BaseEmitter::reportError((BaseEmitter *)unaff_RBX,1,(char *)0x0);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  else {
    unaff_R12 = &(this->super_BaseBuilder)._allocator;
    unaff_R15 = (FuncNode *)ZoneAllocator::_alloc(unaff_R12,0x248,&local_40);
    unaff_RBX = this;
    unaff_R13 = signature;
    unaff_R14 = out;
    if (unaff_R15 == (FuncNode *)0x0) goto LAB_001153b2;
    (unaff_R15->super_LabelNode).super_BaseNode.field_0.field_0._prev = (BaseNode *)0x0;
    (unaff_R15->super_LabelNode).super_BaseNode.field_0.field_0._next = (BaseNode *)0x0;
    (unaff_R15->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\x03';
    (unaff_R15->super_LabelNode).super_BaseNode.field_1._any._nodeFlags =
         (byte)(this->super_BaseBuilder)._nodeFlags | 0x50;
    memset((void *)((long)&(unaff_R15->super_LabelNode).super_BaseNode.field_1 + 2),0,0x21e);
    (unaff_R15->_frame)._spRegId = 0xff;
    (unaff_R15->_frame)._saRegId = 0xff;
    (unaff_R15->_frame)._daOffset = 0xffffffff;
    unaff_R15->_exitNode = (LabelNode *)0x0;
    unaff_R15->_end = (SentinelNode *)0x0;
    unaff_R15->_args = (ArgPack *)0x0;
    (unaff_R15->super_LabelNode).super_BaseNode.field_1._any._nodeType = '\x10';
  }
  EVar2 = BaseBuilder::_newLabelNode(&unaff_RBX->super_BaseBuilder,&unaff_R15->_exitNode);
  if (EVar2 != 0) {
    return EVar2;
  }
  if (unaff_R12->_zone == (Zone *)0x0) {
    _newFuncNode();
LAB_001153d6:
    unaff_R15->_end = (SentinelNode *)0x0;
    EVar2 = BaseEmitter::reportError((BaseEmitter *)unaff_RBX,1,(char *)0x0);
    if (EVar2 != 0) {
      return EVar2;
    }
  }
  else {
    pSVar4 = (SentinelNode *)ZoneAllocator::_alloc(unaff_R12,0x30,&local_40);
    local_38 = unaff_R14;
    if (pSVar4 == (SentinelNode *)0x0) goto LAB_001153d6;
    (pSVar4->super_BaseNode).field_0.field_0._prev = (BaseNode *)0x0;
    (pSVar4->super_BaseNode).field_0.field_0._next = (BaseNode *)0x0;
    (pSVar4->super_BaseNode).field_1._any._nodeType = '\n';
    (pSVar4->super_BaseNode).field_1._any._nodeFlags =
         (byte)(unaff_RBX->super_BaseBuilder)._nodeFlags | 0x14;
    *(undefined8 *)((long)&(pSVar4->super_BaseNode).field_1 + 2) = 0;
    *(undefined8 *)((long)&(pSVar4->super_BaseNode).field_3 + 2) = 0;
    (pSVar4->super_BaseNode)._passData = (void *)0x0;
    (pSVar4->super_BaseNode)._inlineComment = (char *)0x0;
    (pSVar4->super_BaseNode).field_1._any._reserved0 = '\x01';
    unaff_R15->_end = pSVar4;
  }
  this_00 = &(unaff_R15->super_LabelNode).field_0x34;
  EVar2 = FuncDetail::init((FuncDetail *)this_00,(EVP_PKEY_CTX *)unaff_R13);
  if (EVar2 == 0) {
    uVar3 = Environment::stackAlignment
                      (&(unaff_RBX->super_BaseBuilder).super_BaseEmitter._environment);
    if ((byte)unaff_R15->field_0x39 < uVar3) {
      unaff_R15->field_0x39 = (char)uVar3;
    }
    EVar2 = FuncFrame::init(&unaff_R15->_frame,(EVP_PKEY_CTX *)this_00);
    ppFVar1 = local_38;
    if (EVar2 == 0) {
      unaff_R15->_args = (ArgPack *)0x0;
      if (unaff_R15->field_0xa4 == 0) {
LAB_0011538a:
        EVar2 = BaseBuilder::registerLabelNode
                          (&unaff_RBX->super_BaseBuilder,&unaff_R15->super_LabelNode);
        if (EVar2 != 0) {
          return EVar2;
        }
        *ppFVar1 = unaff_R15;
        return 0;
      }
      if (unaff_R12->_zone == (Zone *)0x0) {
        _newFuncNode();
      }
      else {
        __s = (ArgPack *)
              ZoneAllocator::_alloc(unaff_R12,(ulong)(byte)unaff_R15->field_0xa4 << 5,&local_40);
        unaff_R15->_args = __s;
        if (__s != (ArgPack *)0x0) {
          memset(__s,0,(ulong)(byte)unaff_R15->field_0xa4 << 5);
          goto LAB_0011538a;
        }
      }
      EVar2 = 1;
    }
  }
  EVar2 = BaseEmitter::reportError((BaseEmitter *)unaff_RBX,EVar2,(char *)0x0);
  return EVar2;
}

Assistant:

Error BaseCompiler::_newFuncNode(FuncNode** out, const FuncSignature& signature) {
  *out = nullptr;

  // Create FuncNode together with all the required surrounding nodes.
  FuncNode* funcNode;
  ASMJIT_PROPAGATE(_newNodeT<FuncNode>(&funcNode));
  ASMJIT_PROPAGATE(_newLabelNode(&funcNode->_exitNode));
  ASMJIT_PROPAGATE(_newNodeT<SentinelNode>(&funcNode->_end, SentinelNode::kSentinelFuncEnd));

  // Initialize the function's detail info.
  Error err = funcNode->detail().init(signature, environment());
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  // If the Target guarantees greater stack alignment than required by the
  // calling convention then override it as we can prevent having to perform
  // dynamic stack alignment
  uint32_t environmentStackAlignment = _environment.stackAlignment();

  if (funcNode->_funcDetail._callConv.naturalStackAlignment() < environmentStackAlignment)
    funcNode->_funcDetail._callConv.setNaturalStackAlignment(environmentStackAlignment);

  // Initialize the function frame.
  err = funcNode->_frame.init(funcNode->_funcDetail);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  // Allocate space for function arguments.
  funcNode->_args = nullptr;
  if (funcNode->argCount() != 0) {
    funcNode->_args = _allocator.allocT<FuncNode::ArgPack>(funcNode->argCount() * sizeof(FuncNode::ArgPack));
    if (ASMJIT_UNLIKELY(!funcNode->_args))
      return reportError(DebugUtils::errored(kErrorOutOfMemory));
    memset(funcNode->_args, 0, funcNode->argCount() * sizeof(FuncNode::ArgPack));
  }

  ASMJIT_PROPAGATE(registerLabelNode(funcNode));

  *out = funcNode;
  return kErrorOk;
}